

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void * mcpl_internal_realloc(void *mem,size_t new_size)

{
  void *pvVar1;
  
  pvVar1 = realloc(mem,new_size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  (*mcpl_error_handler)("memory allocation failed");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void * mcpl_internal_realloc( void* mem, size_t new_size)
{
  void * res = realloc( mem, new_size );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}